

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_address_tests.cpp
# Opt level: O1

void __thiscall IpAddressTests_Decrement_Test::TestBody(IpAddressTests_Decrement_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  reference lhs;
  int iVar3;
  char *message;
  address addr;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  address local_2c;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  iVar3 = 0xb;
  ip::address::address(&local_2c,0xc6,'\x01','\x01','\v');
  do {
    ip::address::operator--(&local_2c,0);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  poVar2 = ip::operator<<((ostream *)&std::cout,&local_2c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_40.ptr_._0_4_ = 3;
  lhs = ip::address::operator[](&local_2c,(int *)&local_40);
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_char,int>(local_28,"addr[3]","0",lhs,(int *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DeveloperPaul123[P]modern-cpp-challenge/language-features/test/ip_address_tests.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
      local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(IpAddressTests, Decrement)
{
    ip::address addr = { 198, 1, 1, 11 };

    for(int i = 0; i < 11; i++)
    {
        addr--;
    }

    std::cout << addr << std::endl;

    ASSERT_EQ(addr[3], 0);
}